

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O2

int libssh2_userauth_publickey_frommemory
              (LIBSSH2_SESSION *session,char *user,size_t user_len,char *publickeyfiledata,
              size_t publickeyfiledata_len,char *privatekeyfiledata,size_t privatekeyfiledata_len,
              char *passphrase)

{
  size_t username_len;
  int iVar1;
  time_t start_time;
  char *passphrase_00;
  uchar *pubkeydata;
  size_t pubkeydata_len;
  size_t *local_78;
  uchar **local_70;
  size_t local_68;
  char *local_60;
  size_t local_58;
  char *local_50;
  privkey_file *local_48;
  privkey_file privkey_file;
  
  passphrase_00 = "";
  if (passphrase != (char *)0x0) {
    passphrase_00 = passphrase;
  }
  local_68 = user_len;
  local_50 = user;
  start_time = time((time_t *)0x0);
  username_len = local_68;
  local_70 = &session->userauth_pblc_method;
  local_78 = &session->userauth_pblc_method_len;
  local_60 = publickeyfiledata;
  local_58 = publickeyfiledata_len;
  do {
    pubkeydata = (uchar *)0x0;
    pubkeydata_len = 0;
    local_48 = &privkey_file;
    privkey_file.filename = privatekeyfiledata;
    privkey_file.passphrase = passphrase_00;
    if (session->userauth_pblc_state == libssh2_NB_state_idle) {
      if (publickeyfiledata == (char *)0x0 || publickeyfiledata_len == 0) {
        if (privatekeyfiledata != (char *)0x0 && privatekeyfiledata_len != 0) {
          iVar1 = _libssh2_pub_priv_keyfilememory
                            (session,local_70,local_78,&pubkeydata,&pubkeydata_len,
                             privatekeyfiledata,privatekeyfiledata_len,passphrase_00);
          goto LAB_001281e4;
        }
        iVar1 = _libssh2_error(session,-0x10,"Invalid data in public and private key.");
      }
      else {
        iVar1 = memory_read_publickey
                          (session,local_70,local_78,&pubkeydata,&pubkeydata_len,local_60,local_58);
LAB_001281e4:
        if (iVar1 == 0) goto LAB_00128134;
      }
    }
    else {
LAB_00128134:
      iVar1 = _libssh2_userauth_publickey
                        (session,local_50,username_len,pubkeydata,pubkeydata_len,sign_frommemory,
                         &local_48);
      if (pubkeydata != (uchar *)0x0) {
        (*session->free)(pubkeydata,&session->abstract);
      }
    }
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  } while( true );
}

Assistant:

static int
userauth_publickey_frommemory(LIBSSH2_SESSION *session,
                              const char *username,
                              size_t username_len,
                              const char *publickeydata,
                              size_t publickeydata_len,
                              const char *privatekeydata,
                              size_t privatekeydata_len,
                              const char *passphrase)
{
    unsigned char *pubkeydata = NULL;
    size_t pubkeydata_len = 0;
    struct privkey_file privkey_file;
    void *abstract = &privkey_file;
    int rc;

    privkey_file.filename = privatekeydata;
    privkey_file.passphrase = passphrase;

    if(session->userauth_pblc_state == libssh2_NB_state_idle) {
        if(publickeydata_len && publickeydata) {
            rc = memory_read_publickey(session, &session->userauth_pblc_method,
                                       &session->userauth_pblc_method_len,
                                       &pubkeydata, &pubkeydata_len,
                                       publickeydata, publickeydata_len);
            if(rc)
                return rc;
        }
        else if(privatekeydata_len && privatekeydata) {
            /* Compute public key from private key. */
            rc = _libssh2_pub_priv_keyfilememory(session,
                                            &session->userauth_pblc_method,
                                            &session->userauth_pblc_method_len,
                                            &pubkeydata, &pubkeydata_len,
                                            privatekeydata, privatekeydata_len,
                                            passphrase);
            if(rc)
                return rc;
        }
        else {
            return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                                  "Invalid data in public and private key.");
        }
    }

    rc = _libssh2_userauth_publickey(session, username, username_len,
                                     pubkeydata, pubkeydata_len,
                                     sign_frommemory, &abstract);
    if(pubkeydata)
        LIBSSH2_FREE(session, pubkeydata);

    return rc;
}